

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O2

int DSA_sign(int type,uchar *dgst,int dlen,uchar *sig,uint *siglen,DSA *dsa)

{
  uint uVar1;
  DSA_SIG *a;
  uint8_t *out_sig_local;
  
  out_sig_local = sig;
  a = DSA_do_sign(dgst,dlen,dsa);
  if (a == (DSA_SIG *)0x0) {
    *siglen = 0;
  }
  else {
    uVar1 = i2d_DSA_SIG(a,&out_sig_local);
    *siglen = uVar1;
    DSA_SIG_free(a);
  }
  return (uint)(a != (DSA_SIG *)0x0);
}

Assistant:

int DSA_sign(int type, const uint8_t *digest, size_t digest_len,
             uint8_t *out_sig, unsigned int *out_siglen, const DSA *dsa) {
  DSA_SIG *s;

  s = DSA_do_sign(digest, digest_len, dsa);
  if (s == NULL) {
    *out_siglen = 0;
    return 0;
  }

  *out_siglen = i2d_DSA_SIG(s, &out_sig);
  DSA_SIG_free(s);
  return 1;
}